

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateExport.cpp
# Opt level: O0

void helicsEndpointSendBytes
               (HelicsEndpoint endpoint,void *data,int inputDataLength,HelicsError *err)

{
  size_t in_RCX;
  int in_EDX;
  void *__buf;
  long in_RSI;
  int in_R8D;
  EndpointObject *endObj;
  Endpoint *this;
  HelicsError *in_stack_ffffffffffffffa0;
  data_view *this_00;
  HelicsEndpoint in_stack_ffffffffffffffa8;
  data_view local_48;
  EndpointObject *local_28;
  int local_14;
  long local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  local_28 = anon_unknown.dwarf_784a3::verifyEndpoint
                       (in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  if (local_28 != (EndpointObject *)0x0) {
    if ((local_10 == 0) || (local_14 < 1)) {
      this = local_28->endPtr;
      this_00 = &local_48;
      helics::data_view::data_view<std::__cxx11::string_const&,void>
                (this_00,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
      helics::Endpoint::send(this,(int)this_00,__buf,in_RCX,in_R8D);
      helics::data_view::~data_view((data_view *)0x1de773);
    }
    else {
      helics::Endpoint::send(local_28->endPtr,(int)local_10,(void *)(long)local_14,in_RCX,in_R8D);
    }
  }
  return;
}

Assistant:

void helicsEndpointSendBytes(HelicsEndpoint endpoint, const void* data, int inputDataLength, HelicsError* err)
{
    auto* endObj = verifyEndpoint(endpoint, err);
    if (endObj == nullptr) {
        return;
    }
    try {
        if ((data == nullptr) || (inputDataLength <= 0)) {
            endObj->endPtr->send(gHelicsEmptyStr);
        } else {
            endObj->endPtr->send(reinterpret_cast<const char*>(data), inputDataLength);
        }
    }
    catch (...) {
        helicsErrorHandler(err);
    }
}